

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall btMatrixX<float>::resize(btMatrixX<float> *this,int rows,int cols)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this->m_resizeOperations = this->m_resizeOperations + 1;
  this->m_rows = rows;
  this->m_cols = cols;
  CProfileManager::Start_Profile("m_storage.resize");
  iVar6 = cols * rows;
  iVar1 = (this->m_storage).m_size;
  if ((iVar1 <= iVar6) && (iVar1 < iVar6)) {
    if ((this->m_storage).m_capacity < iVar6) {
      if (iVar6 == 0) {
        pfVar3 = (float *)0x0;
      }
      else {
        pfVar3 = (float *)btAlignedAllocInternal((long)iVar6 << 2,0x10);
      }
      lVar4 = (long)(this->m_storage).m_size;
      if (0 < lVar4) {
        pfVar2 = (this->m_storage).m_data;
        lVar5 = 0;
        do {
          pfVar3[lVar5] = pfVar2[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      pfVar2 = (this->m_storage).m_data;
      if (pfVar2 != (float *)0x0) {
        if ((this->m_storage).m_ownsMemory == true) {
          btAlignedFreeInternal(pfVar2);
        }
        (this->m_storage).m_data = (float *)0x0;
      }
      (this->m_storage).m_ownsMemory = true;
      (this->m_storage).m_data = pfVar3;
      (this->m_storage).m_capacity = iVar6;
    }
    if (iVar1 < iVar6) {
      memset((this->m_storage).m_data + iVar1,0,((long)iVar6 - (long)iVar1) * 4);
    }
  }
  (this->m_storage).m_size = iVar6;
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void resize(int rows, int cols)
	{
		m_resizeOperations++;
		m_rows = rows;
		m_cols = cols;
		{
			BT_PROFILE("m_storage.resize");
			m_storage.resize(rows*cols);
		}
	}